

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cut.cpp
# Opt level: O0

int dfs_dinic(int v,int t,int flow)

{
  int iVar1;
  int t_00;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  int *piVar7;
  int local_28;
  int local_24;
  int local_20;
  int pushed;
  int next;
  int ind;
  int flow_local;
  int t_local;
  int v_local;
  
  if (flow == 0) {
    t_local = 0;
  }
  else {
    next = flow;
    ind = t;
    flow_local = v;
    t_local = flow;
    if (v != t) {
      while( true ) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::ptr,
                            (long)flow_local);
        iVar2 = *pvVar3;
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(anonymous_namespace)::edges_dup,(long)flow_local);
        sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
        if ((int)sVar5 <= iVar2) break;
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(anonymous_namespace)::edges_dup,(long)flow_local);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::ptr,
                            (long)flow_local);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)*pvVar3);
        pushed = *pvVar3;
        pvVar6 = std::
                 vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                 ::operator[]((vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                               *)(anonymous_namespace)::edgelist,(long)pushed);
        local_20 = pvVar6->b;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::dis,
                            (long)local_20);
        iVar2 = *pvVar3;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::dis,
                            (long)flow_local);
        t_00 = ind;
        iVar1 = local_20;
        if (iVar2 == *pvVar3 + 1) {
          pvVar6 = std::
                   vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                   ::operator[]((vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                                 *)(anonymous_namespace)::edgelist,(long)pushed);
          iVar2 = pvVar6->c;
          pvVar6 = std::
                   vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                   ::operator[]((vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                                 *)(anonymous_namespace)::edgelist,(long)pushed);
          local_28 = iVar2 - pvVar6->flow;
          piVar7 = std::min<int>(&next,&local_28);
          iVar2 = dfs_dinic(iVar1,t_00,*piVar7);
          if (iVar2 != 0) {
            local_24 = iVar2;
            pvVar6 = std::
                     vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                     ::operator[]((vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                                   *)(anonymous_namespace)::edgelist,(long)pushed);
            iVar1 = local_24;
            pvVar6->flow = iVar2 + pvVar6->flow;
            pvVar6 = std::
                     vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                     ::operator[]((vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                                   *)(anonymous_namespace)::edgelist,(long)(int)(pushed ^ 1));
            pvVar6->flow = pvVar6->flow - iVar1;
            return local_24;
          }
          local_24 = 0;
        }
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::ptr,
                            (long)flow_local);
        *pvVar3 = *pvVar3 + 1;
      }
      t_local = 0;
    }
  }
  return t_local;
}

Assistant:

int dfs_dinic(int v, int t, int flow) {
    if (!flow) {
        return 0;
    }
    
    if (v == t) {
        return flow;
    }
    
    for (; ptr[v] < (int) edges_dup[v].size(); ptr[v]++) {
        int ind = edges_dup[v][ptr[v]];
        int next = edgelist[ind].b;
        
        if (dis[next] != dis[v] + 1) {
            continue;
        }
        
        int pushed = dfs_dinic(next, t, min(flow, edgelist[ind].c - edgelist[ind].flow));
        
        if (pushed) {
            edgelist[ind].flow += pushed;
            edgelist[ind ^ 1].flow -= pushed;
            return pushed;
        }
    }
    
    return 0;
}